

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test3.cpp
# Opt level: O0

int main(void)

{
  allocator<P> *this;
  initializer_list<P> __l;
  initializer_list<P> __l_00;
  initializer_list<P> __l_01;
  allocator<P> local_109;
  P local_108;
  P local_100;
  P local_f8;
  P local_f0;
  P local_e8;
  P local_e0;
  P local_d8;
  P local_d0;
  P local_c8;
  iterator local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  vector<P,_std::allocator<P>_> v3;
  P local_90;
  P local_88;
  P local_80;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<P,_std::allocator<P>_> v2;
  allocator<P> local_39;
  P local_38;
  P *local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<P,_std::allocator<P>_> v1;
  
  P::P(&local_38,1,0);
  local_28 = 1;
  local_30 = &local_38;
  std::allocator<P>::allocator(&local_39);
  __l_01._M_len = local_28;
  __l_01._M_array = local_30;
  std::vector<P,_std::allocator<P>_>::vector
            ((vector<P,_std::allocator<P>_> *)local_20,__l_01,&local_39);
  std::allocator<P>::~allocator(&local_39);
  test_vector<P>((vector<P,_std::allocator<P>_> *)local_20);
  P::P(&local_90,0,1);
  P::P(&local_88,2,3);
  P::P(&local_80,4,5);
  local_78 = &local_90;
  local_70 = 3;
  this = (allocator<P> *)
         ((long)&v3.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 7);
  std::allocator<P>::allocator(this);
  __l_00._M_len = local_70;
  __l_00._M_array = local_78;
  std::vector<P,_std::allocator<P>_>::vector((vector<P,_std::allocator<P>_> *)local_68,__l_00,this);
  std::allocator<P>::~allocator
            ((allocator<P> *)
             ((long)&v3.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage + 7));
  test_vector<P>((vector<P,_std::allocator<P>_> *)local_68);
  P::P(&local_108,1,0);
  P::P(&local_100,2,1);
  P::P(&local_f8,3,2);
  P::P(&local_f0,4,3);
  P::P(&local_e8,5,4);
  P::P(&local_e0,6,5);
  P::P(&local_d8,7,6);
  P::P(&local_d0,8,7);
  P::P(&local_c8,9,8);
  local_c0 = &local_108;
  local_b8 = 9;
  std::allocator<P>::allocator(&local_109);
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::vector<P,_std::allocator<P>_>::vector
            ((vector<P,_std::allocator<P>_> *)local_b0,__l,&local_109);
  std::allocator<P>::~allocator(&local_109);
  test_vector<P>((vector<P,_std::allocator<P>_> *)local_b0);
  std::vector<P,_std::allocator<P>_>::~vector((vector<P,_std::allocator<P>_> *)local_b0);
  std::vector<P,_std::allocator<P>_>::~vector((vector<P,_std::allocator<P>_> *)local_68);
  std::vector<P,_std::allocator<P>_>::~vector((vector<P,_std::allocator<P>_> *)local_20);
  return 0;
}

Assistant:

int main()
{
	// 1 element
	std::vector<P> v1 = { P(1,0) };
	test_vector(v1);

	// 3 elements
	std::vector<P> v2 = { P{0, 1}, P{2, 3}, P(4, 5)};
	test_vector(v2);

	// 9 elements
	std::vector<P> v3 = { P{1,0}, P{2,1}, P{3,2}
						, P{4,3}, P{5,4}, P{6,5}
						, P{7,6}, P{8,7}, P{9,8}
						};
	test_vector(v3);
}